

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O3

int jsonquoted(char *in,size_t len,dynbuf *out,_Bool lowercase)

{
  byte bVar1;
  CURLcode CVar2;
  undefined8 in_RAX;
  byte bVar3;
  size_t len_00;
  char *mem;
  uchar *i;
  char *pcVar4;
  undefined8 uStack_38;
  
  if ((long)len < 1) {
    return 0;
  }
  pcVar4 = in + 1;
  uStack_38 = in_RAX;
  do {
    bVar1 = pcVar4[-1];
    switch(bVar1) {
    case 8:
      len_00 = 2;
      mem = "\\b";
      break;
    case 9:
      len_00 = 2;
      mem = "\\t";
      break;
    case 10:
      len_00 = 2;
      mem = "\\n";
      break;
    case 0xb:
switchD_0011ef51_caseD_b:
      if (0x1f < bVar1) {
        bVar3 = bVar1 | 0x20;
        if (!lowercase) {
          bVar3 = bVar1;
        }
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar3 = bVar1;
        }
        uStack_38 = CONCAT17(bVar3,(undefined7)uStack_38);
        len_00 = 1;
        mem = (char *)((long)&uStack_38 + 7);
        break;
      }
      CVar2 = curlx_dyn_addf(out,"\\u%04x");
      goto LAB_0011f019;
    case 0xc:
      len_00 = 2;
      mem = "\\f";
      break;
    case 0xd:
      len_00 = 2;
      mem = "\\r";
      break;
    default:
      if (bVar1 == 0x22) {
        len_00 = 2;
        mem = "\\\"";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_0011ef51_caseD_b;
        len_00 = 2;
        mem = "\\\\";
      }
    }
    CVar2 = curlx_dyn_addn(out,mem,len_00);
LAB_0011f019:
    if ((in + len <= pcVar4) || (pcVar4 = pcVar4 + 1, CVar2 != CURLE_OK)) {
      return CVar2;
    }
  } while( true );
}

Assistant:

int jsonquoted(const char *in, size_t len,
               struct curlx_dynbuf *out, bool lowercase)
{
  const unsigned char *i = (const unsigned char *)in;
  const unsigned char *in_end = &i[len];
  CURLcode result = CURLE_OK;

  for(; (i < in_end) && !result; i++) {
    switch(*i) {
    case '\\':
      result = curlx_dyn_addn(out, "\\\\", 2);
      break;
    case '\"':
      result = curlx_dyn_addn(out, "\\\"", 2);
      break;
    case '\b':
      result = curlx_dyn_addn(out, "\\b", 2);
      break;
    case '\f':
      result = curlx_dyn_addn(out, "\\f", 2);
      break;
    case '\n':
      result = curlx_dyn_addn(out, "\\n", 2);
      break;
    case '\r':
      result = curlx_dyn_addn(out, "\\r", 2);
      break;
    case '\t':
      result = curlx_dyn_addn(out, "\\t", 2);
      break;
    default:
      if(*i < 32)
        result = curlx_dyn_addf(out, "\\u%04x", *i);
      else {
        char o = (char)*i;
        if(lowercase && (o >= 'A' && o <= 'Z'))
          /* do not use tolower() since that is locale specific */
          o |= ('a' - 'A');
        result = curlx_dyn_addn(out, &o, 1);
      }
      break;
    }
  }
  if(result)
    return (int)result;
  return 0;
}